

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

void __thiscall Server::handNewConn(Server *this)

{
  undefined8 uVar1;
  uint fd;
  int iVar2;
  EventLoop *loop;
  HttpData *this_00;
  undefined1 auStack_c8 [8];
  sockaddr_in client_addr;
  _Bind<void_(HttpData::*(std::shared_ptr<HttpData>))()> local_b0;
  __shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_80 [32];
  code *local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  shared_ptr<HttpData> req_info;
  socklen_t local_34 [2];
  socklen_t client_addr_len;
  
  auStack_c8._0_2_ = 0;
  auStack_c8[2] = '\0';
  auStack_c8[3] = '\0';
  auStack_c8[4] = '\0';
  auStack_c8[5] = '\0';
  auStack_c8[6] = '\0';
  auStack_c8[7] = '\0';
  client_addr.sin_family = 0;
  client_addr.sin_port = 0;
  client_addr.sin_addr.s_addr = 0;
  local_34[0] = 0x10;
  req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  while( true ) {
    while( true ) {
      fd = accept(this->listenFd_,(sockaddr *)auStack_c8,local_34);
      if ((int)fd < 1) {
        ((this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        events_ = 0x80000001;
        return;
      }
      loop = EventLoopThreadPool::getNextLoop
                       ((this->eventLoopThreadPool_)._M_t.
                        super___uniq_ptr_impl<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_EventLoopThreadPool_*,_std::default_delete<EventLoopThreadPool>_>
                        .super__Head_base<0UL,_EventLoopThreadPool_*,_false>._M_head_impl);
      if (fd < 100000) break;
      close(fd);
    }
    iVar2 = setSocketNonBlocking(fd);
    if (iVar2 < 0) break;
    setSocketNodelay(fd);
    this_00 = (HttpData *)operator_new(0x2c0);
    HttpData::HttpData(this_00,loop,fd);
    std::__shared_ptr<HttpData,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HttpData,void>
              ((__shared_ptr<HttpData,(__gnu_cxx::_Lock_policy)2> *)local_50,this_00);
    std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)local_80,
               (__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *)((long)local_50 + 0x18));
    uVar1 = local_80._0_8_;
    std::__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,(__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    std::__weak_ptr<HttpData,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<HttpData,(__gnu_cxx::_Lock_policy)2> *)(uVar1 + 0x18),&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    local_60 = HttpData::newEvent;
    local_58 = 0;
    std::_Bind<void(HttpData::*(std::shared_ptr<HttpData>))()>::_Bind<std::shared_ptr<HttpData>&>
              ((_Bind<void(HttpData::*(std::shared_ptr<HttpData>))()> *)&local_b0,
               (offset_in_HttpData_to_subr *)&local_60,(shared_ptr<HttpData> *)local_50);
    std::function<void()>::function<std::_Bind<void(HttpData::*(std::shared_ptr<HttpData>))()>,void>
              ((function<void()> *)local_80,&local_b0);
    EventLoop::queueInLoop(loop,(Functor *)local_80);
    std::_Function_base::~_Function_base((_Function_base *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_b0._M_bound_args.super__Tuple_impl<0UL,_std::shared_ptr<HttpData>_>.
                       super__Head_base<0UL,_std::shared_ptr<HttpData>,_false>._M_head_impl.
                       super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2> + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&req_info);
    this = (Server *)req_info.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  return;
}

Assistant:

void Server::handNewConn() {
  struct sockaddr_in client_addr;
  memset(&client_addr, 0, sizeof(struct sockaddr_in));
  socklen_t client_addr_len = sizeof(client_addr);
  int accept_fd = 0;
  while ((accept_fd = accept(listenFd_, (struct sockaddr *)&client_addr,
                             &client_addr_len)) > 0) {
    EventLoop *loop = eventLoopThreadPool_->getNextLoop();
    //LOG << "New connection from " << inet_ntoa(client_addr.sin_addr) << ":"
    //    << ntohs(client_addr.sin_port) << " fd : " << accept_fd;
    // cout << "new connection" << endl;
    // cout << inet_ntoa(client_addr.sin_addr) << endl;
    // cout << ntohs(client_addr.sin_port) << endl;
    /*
    // TCP的保活机制默认是关闭的
    int optval = 0;
    socklen_t len_optval = 4;
    getsockopt(accept_fd, SOL_SOCKET,  SO_KEEPALIVE, &optval, &len_optval);
    cout << "optval ==" << optval << endl;
    */
    // 限制服务器的最大并发连接数
    if (accept_fd >= MAXFDS) {
      close(accept_fd);
      continue;
    }
    // 设为非阻塞模式
    if (setSocketNonBlocking(accept_fd) < 0) {
      //LOG << "Set non block failed!";
      // perror("Set non block failed!");
      return;
    }

    setSocketNodelay(accept_fd);
    // setSocketNoLinger(accept_fd);

    shared_ptr<HttpData> req_info(new HttpData(loop, accept_fd));
    req_info->getChannel()->setHolder(req_info);
    loop->queueInLoop(std::bind(&HttpData::newEvent, req_info));
  }
  acceptChannel_->setEvents(EPOLLIN | EPOLLET);
}